

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_msg_init_control(ws_frame **framep,nni_ws *ws,uint8_t op,uint8_t *buf,size_t len)

{
  ws_frame *frame_00;
  ws_frame *frame;
  size_t len_local;
  uint8_t *buf_local;
  uint8_t op_local;
  nni_ws *ws_local;
  ws_frame **framep_local;
  
  if (len < 0x7e) {
    frame_00 = (ws_frame *)nni_zalloc(0xd8);
    if (frame_00 == (ws_frame *)0x0) {
      framep_local._4_4_ = 2;
    }
    else {
      memcpy(frame_00->sdata,buf,len);
      frame_00->len = len;
      frame_00->final = true;
      frame_00->op = (uint)op;
      frame_00->head[0] = op | 0x80;
      frame_00->head[1] = (byte)len & 0x7f;
      frame_00->hlen = 2;
      frame_00->buf = frame_00->sdata;
      frame_00->asize = 0;
      if ((ws->server & 1U) == 0) {
        ws_mask_frame(frame_00);
      }
      else {
        frame_00->masked = false;
      }
      *framep = frame_00;
      framep_local._4_4_ = 0;
    }
  }
  else {
    framep_local._4_4_ = 3;
  }
  return framep_local._4_4_;
}

Assistant:

static int
ws_msg_init_control(
    ws_frame **framep, nni_ws *ws, uint8_t op, const uint8_t *buf, size_t len)
{
	ws_frame *frame;

	if (len > 125) {
		return (NNG_EINVAL);
	}

	if ((frame = NNI_ALLOC_STRUCT(frame)) == NULL) {
		return (NNG_ENOMEM);
	}

	memcpy(frame->sdata, buf, len);
	frame->len     = len;
	frame->final   = true;
	frame->op      = op;
	frame->head[0] = op | 0x80; // final frame (control)
	frame->head[1] = len & 0x7F;
	frame->hlen    = 2;
	frame->buf     = frame->sdata;
	frame->asize   = 0;

	if (ws->server) {
		frame->masked = false;
	} else {
		ws_mask_frame(frame);
	}

	*framep = frame;
	return (0);
}